

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall Math_TwoProd_Test::~Math_TwoProd_Test(Math_TwoProd_Test *this)

{
  void *in_RDI;
  
  ~Math_TwoProd_Test((Math_TwoProd_Test *)0x6088f8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Math, TwoProd) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a = r(), b = r();
        CompensatedFloat tp = TwoProd(a, b);
        EXPECT_EQ((Float)tp, a * b);
        EXPECT_EQ((double)tp, (double)a * (double)b);
    }
}